

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O0

void * gdImageGifAnimEndPtr(int *size)

{
  char *rv;
  int *size_local;
  
  size_local = (int *)gdMalloc(1);
  if (size_local == (int *)0x0) {
    size_local = (int *)0x0;
  }
  else {
    *(undefined1 *)size_local = 0x3b;
    *size = 1;
  }
  return size_local;
}

Assistant:

BGD_DECLARE(void *) gdImageGifAnimEndPtr(int *size)
{
	char *rv = (char *) gdMalloc(1);
	if(!rv) {
		return 0;
	}
	*rv = ';';
	*size = 1;
	return (void *)rv;
}